

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QStringList * __thiscall QLocale::uiLanguages(QLocale *this,TagSeparator separator)

{
  QLatin1StringView str;
  anon_class_6_1_898ed151_for__M_pred __pred;
  QStringView after;
  QStringView before;
  QStringView stem;
  QStringView stem_00;
  QStringView stem_01;
  QLatin1String name_00;
  QStringView name_01;
  QStringView name_02;
  QStringView name_03;
  QStringView name_04;
  QStringView name_05;
  QStringView *pQVar1;
  bool bVar2;
  undefined1 uVar3;
  Language LVar4;
  QLocaleId QVar5;
  QLocalePrivate *pQVar6;
  QSystemLocale *pQVar7;
  const_reference pQVar8;
  qsizetype qVar9;
  undefined1 *puVar10;
  byte in_DL;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  bool bVar11;
  qsizetype k;
  bool seen;
  qsizetype as;
  qsizetype j_1;
  bool justAfter;
  bool found;
  qsizetype at;
  qsizetype stopAt;
  qsizetype i_3;
  qsizetype afterTruncs;
  qsizetype afterEquivs;
  qsizetype i_2;
  bool faithful;
  qsizetype i_1;
  QString *entry;
  add_const_t<QList<QString>_> *__range2;
  bool isSystem;
  char sep;
  QStringList *uiLanguages;
  size_t RuntimeThreshold_1;
  size_t RuntimeThreshold;
  size_t i;
  size_t i_4;
  size_t RuntimeThreshold_2;
  size_t i_5;
  QStringView head;
  QByteArray laterFull;
  QString later;
  QString prefix;
  QLocaleId max_1;
  QString entry_1;
  anon_class_1_1_ba1d3da2 hasPrefix;
  QLatin1Char cut;
  QLocaleId max;
  QByteArray prior;
  qsizetype j;
  QLocaleId id_1;
  anon_class_6_1_898ed151_for__M_pred isMine;
  QLocaleId mine;
  QLocaleId id;
  QString name;
  const_iterator __end2;
  const_iterator __begin2;
  QChar join;
  QList<QLocaleId> localeIds;
  anon_class_56_6_d83b7451 addIfEquivalent;
  QDuplicateTracker<QString,_32UL> known;
  undefined4 in_stack_fffffffffffff1b8;
  CaseSensitivity in_stack_fffffffffffff1bc;
  undefined4 in_stack_fffffffffffff1c0;
  CaseSensitivity in_stack_fffffffffffff1c4;
  iterator in_stack_fffffffffffff1c8;
  QStringView *in_stack_fffffffffffff1d0;
  undefined7 in_stack_fffffffffffff1d8;
  undefined1 in_stack_fffffffffffff1df;
  anon_class_1_1_ba1d3da2 *in_stack_fffffffffffff1e0;
  undefined2 in_stack_fffffffffffff1e8;
  undefined1 in_stack_fffffffffffff1ea;
  undefined1 in_stack_fffffffffffff1eb;
  QChar in_stack_fffffffffffff1ec;
  undefined1 in_stack_fffffffffffff1ee;
  undefined1 in_stack_fffffffffffff1ef;
  const_iterator in_stack_fffffffffffff1f0;
  const_iterator in_stack_fffffffffffff1f8;
  undefined6 in_stack_fffffffffffff200;
  undefined1 in_stack_fffffffffffff206;
  undefined1 in_stack_fffffffffffff207;
  storage_type_conflict *in_stack_fffffffffffff208;
  storage_type_conflict *psVar12;
  QLocaleId *in_stack_fffffffffffff210;
  undefined5 in_stack_fffffffffffff218;
  undefined1 in_stack_fffffffffffff21d;
  byte in_stack_fffffffffffff21e;
  byte bVar13;
  undefined1 in_stack_fffffffffffff21f;
  bool local_dc2;
  undefined8 in_stack_fffffffffffff248;
  undefined4 in_stack_fffffffffffff258;
  undefined4 in_stack_fffffffffffff25c;
  QStringView *pQVar14;
  undefined7 in_stack_fffffffffffff260;
  char in_stack_fffffffffffff267;
  undefined1 uVar15;
  QLocaleId *in_stack_fffffffffffff268;
  QLocaleId *this_00;
  undefined1 *in_stack_fffffffffffff298;
  QStringView *local_cb0;
  bool local_ca1;
  anon_class_1_1_ba1d3da2 *local_ca0;
  QStringView *local_c98;
  ushort uStack_c8e;
  bool local_c89;
  long local_c80;
  QStringView *local_c70;
  QStringView *local_c68;
  QStringView *local_c60;
  char *local_c58;
  bool local_c49;
  undefined1 *local_c48;
  ulong local_ba0;
  ulong local_b88;
  ulong local_b60;
  QChar local_ade;
  char local_adb;
  undefined4 local_ac4;
  ushort local_ac0;
  undefined4 local_abe;
  ushort local_aba;
  undefined1 *local_ab8;
  undefined1 *puStack_ab0;
  undefined1 *local_aa8;
  undefined1 *local_a98;
  undefined1 *puStack_a90;
  undefined1 *local_a88;
  undefined4 local_a66;
  ushort local_a62;
  storage_type_conflict local_a60 [14];
  char local_a43;
  QString local_a40 [4];
  uint local_9d8;
  uint local_9d4;
  uint local_9d0;
  ushort local_9cc;
  undefined4 local_9b4;
  ushort local_9b0;
  QLocaleId local_9ae [4];
  undefined4 local_996;
  ushort local_992;
  undefined4 local_990;
  ushort local_98c;
  undefined1 *local_988;
  undefined1 *puStack_980;
  undefined1 *local_978;
  char local_96a;
  QLatin1Char local_969;
  uint local_968;
  ushort local_964;
  uint local_960;
  ushort local_95c;
  undefined4 local_958;
  ushort local_954;
  undefined4 local_94e;
  ushort local_94a;
  uint local_948;
  ushort local_944;
  uint local_93e;
  ushort local_93a;
  uint local_938;
  ushort local_934;
  uint local_930;
  ushort local_92c;
  uint local_928;
  ushort local_924;
  uint local_91e;
  ushort local_91a;
  uint local_918;
  ushort local_914;
  uint local_90e;
  ushort local_90a;
  uint local_908;
  undefined2 local_904;
  uint local_8fe;
  undefined2 local_8fa;
  uint local_8f8;
  undefined2 local_8f4;
  uint local_8ee;
  undefined2 local_8ea;
  uint local_8e8;
  undefined2 local_8e4;
  uint local_8de;
  undefined2 local_8da;
  undefined4 local_8d8;
  ushort local_8d4;
  undefined1 *local_898;
  undefined1 *puStack_890;
  undefined1 *local_888;
  undefined1 *local_878 [7];
  undefined4 local_83c;
  ushort local_838;
  undefined4 local_836;
  ushort local_832;
  undefined4 local_800;
  ushort local_7fc;
  undefined4 local_7f4;
  ushort local_7f0;
  undefined4 local_7ec;
  ushort local_7e8;
  undefined4 local_7e4;
  ushort local_7e0;
  undefined4 local_7dc;
  ushort local_7d8;
  undefined4 local_7d6;
  ushort local_7d2;
  undefined1 *local_7b8;
  undefined1 *puStack_7b0;
  undefined1 *local_7a8;
  undefined1 local_7a0 [10];
  undefined4 local_796;
  ushort local_792;
  undefined4 local_77e;
  ushort local_77a;
  QString *local_778;
  const_iterator local_770;
  const_iterator local_768 [5];
  QLatin1Char local_73b;
  undefined2 local_73a;
  QList<QLocaleId> local_720;
  undefined1 **local_708;
  uint local_6f8;
  undefined4 uStack_6f4;
  undefined1 *puStack_6f0;
  undefined1 *local_6e8;
  undefined1 *puStack_6e0;
  undefined1 *local_6d8;
  undefined1 local_6d0 [1672];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x4db423);
  if (in_DL < 0x80) {
    local_720.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_720.d.ptr = (QLocaleId *)&DAT_aaaaaaaaaaaaaaaa;
    local_720.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QLocaleId>::QList((QList<QLocaleId> *)0x4db4b5);
    pQVar6 = QSharedDataPointer<QLocalePrivate>::operator->
                       ((QSharedDataPointer<QLocalePrivate> *)0x4db4c2);
    bVar11 = pQVar6->m_data != &systemLocaleData;
    if (bVar11) {
      QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4dbd83)
      ;
      QVar5 = QLocaleData::id((QLocaleData *)
                              CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
      local_836 = QVar5._0_4_;
      local_832 = QVar5.territory_id;
      QList<QLocaleId>::append
                ((QList<QLocaleId> *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
      local_dc2 = (bool)in_stack_fffffffffffff21e;
    }
    else {
      pQVar7 = systemLocale();
      ::QVariant::QVariant((QVariant *)0x4db50a);
      (*pQVar7->_vptr_QSystemLocale[2])(local_28,pQVar7,0x22,local_48);
      ::QVariant::toStringList
                ((QVariant *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
      QList<QString>::operator=
                ((QList<QString> *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                 (QList<QString> *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
      QList<QString>::~QList((QList<QString> *)0x4db56b);
      ::QVariant::~QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
      ::QVariant::~QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
      local_dc2 = (bool)in_stack_fffffffffffff21e;
      if (in_DL != 0x2d) {
        local_73a = 0xaaaa;
        QLatin1Char::QLatin1Char(&local_73b,in_DL);
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                   (QLatin1Char)(char)((ulong)in_stack_fffffffffffff1c8.i >> 0x38));
        std::data<char16_t_const,2ul>((char16_t (*) [2])L"-");
        for (local_ba0 = 0; (local_ba0 < 2 && (L"-"[local_ba0] != L'\0')); local_ba0 = local_ba0 + 1
            ) {
        }
        QStringView::QStringView<char16_t,_true>
                  (in_stack_fffffffffffff1d0,(char16_t *)in_stack_fffffffffffff1c8.i,
                   CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
        QStringView::QStringView<QChar,_true>
                  (in_stack_fffffffffffff1d0,(QChar *)in_stack_fffffffffffff1c8.i,
                   CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
        before.m_size._6_1_ = in_stack_fffffffffffff206;
        before.m_size._0_6_ = in_stack_fffffffffffff200;
        before.m_size._7_1_ = in_stack_fffffffffffff207;
        before.m_data = in_stack_fffffffffffff208;
        after.m_data = (storage_type_conflict *)in_stack_fffffffffffff1f8.i;
        after.m_size = (qsizetype)in_stack_fffffffffffff1f0.i;
        QListSpecialMethods<QString>::replaceInStrings
                  ((QListSpecialMethods<QString> *)in_stack_fffffffffffff1c8.i,before,after,
                   in_stack_fffffffffffff1c4);
        QList<QString>::operator=
                  ((QList<QString> *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                   (QList<QString> *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
        local_dc2 = (bool)in_stack_fffffffffffff21e;
      }
      local_768[0].i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_768[0] = QList<QString>::begin
                               ((QList<QString> *)
                                CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
      local_770.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_770 = QList<QString>::end((QList<QString> *)
                                      CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0))
      ;
      while( true ) {
        local_778 = local_770.i;
        bVar2 = QList<QString>::const_iterator::operator!=(local_768,local_770);
        if (!bVar2) break;
        QList<QString>::const_iterator::operator*(local_768);
        QStringView::QStringView<QString,_true>
                  (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8.i);
        name_01.m_size._4_4_ = in_stack_fffffffffffff25c;
        name_01.m_size._0_4_ = in_stack_fffffffffffff258;
        name_01.m_data._0_7_ = in_stack_fffffffffffff260;
        name_01.m_data._7_1_ = in_stack_fffffffffffff267;
        QVar5 = QLocaleId::fromName(name_01);
        local_77e = QVar5._0_4_;
        local_77a = QVar5.territory_id;
        QList<QLocaleId>::append
                  ((QList<QLocaleId> *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0)
                   ,(rvalue_ref)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
        QList<QString>::const_iterator::operator++(local_768);
      }
      bVar2 = QList<QLocaleId>::isEmpty((QList<QLocaleId> *)0x4db905);
      if (bVar2) {
        pQVar7 = systemLocale();
        (*pQVar7->_vptr_QSystemLocale[3])(local_7a0);
        QSharedDataPointer<QLocalePrivate>::operator->
                  ((QSharedDataPointer<QLocalePrivate> *)
                   CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
        QVar5 = QLocaleData::id((QLocaleData *)
                                CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
        local_796 = QVar5._0_4_;
        local_792 = QVar5.territory_id;
        QList<QLocaleId>::append
                  ((QList<QLocaleId> *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0)
                   ,(rvalue_ref)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
        ~QLocale((QLocale *)0x4db9aa);
      }
      local_7b8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_7b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_7a8 = &DAT_aaaaaaaaaaaaaaaa;
      QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4dba04)
      ;
      QVar5 = QLocaleData::id((QLocaleData *)
                              CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
      local_7d6 = QVar5._0_4_;
      local_7d2 = QVar5.territory_id;
      QLocaleId::name(in_stack_fffffffffffff268,in_stack_fffffffffffff267);
      QString::fromLatin1<void>
                ((QByteArray *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
      QByteArray::~QByteArray((QByteArray *)0x4dba76);
      bVar2 = QString::isEmpty((QString *)0x4dba83);
      if (((!bVar2) && (LVar4 = language((QLocale *)0x4dba98), LVar4 != C)) &&
         (bVar2 = QListSpecialMethods<QString>::contains
                            ((QListSpecialMethods<QString> *)
                             CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
                             (QString *)in_stack_fffffffffffff1d0,
                             (CaseSensitivity)((ulong)in_stack_fffffffffffff1c8.i >> 0x20)), !bVar2)
         ) {
        local_7d8 = 0xaaaa;
        local_7dc = 0xaaaaaaaa;
        QSharedDataPointer<QLocalePrivate>::operator->
                  ((QSharedDataPointer<QLocalePrivate> *)0x4dbafa);
        QVar5 = QLocaleData::id((QLocaleData *)
                                CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
        local_7dc = QVar5._0_4_;
        local_7d8 = QVar5.territory_id;
        local_7e0 = 0xaaaa;
        local_7e4 = 0xaaaaaaaa;
        QVar5 = QLocaleId::withLikelySubtagsRemoved((QLocaleId *)in_stack_fffffffffffff1c8.i);
        local_7ec = QVar5._0_4_;
        local_7e8 = QVar5.territory_id;
        local_7e4 = local_7ec;
        local_7e0 = local_7e8;
        QList<QString>::constBegin
                  ((QList<QString> *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
        QList<QString>::constEnd
                  ((QList<QString> *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
        local_7f0 = local_7e8;
        local_7f4 = local_7ec;
        local_7fc = local_7e8;
        local_800 = local_7ec;
        __pred.mine.language_id._1_1_ = in_stack_fffffffffffff1eb;
        __pred.mine.language_id._0_1_ = in_stack_fffffffffffff1ea;
        __pred.mine.script_id = in_stack_fffffffffffff1ec.ucs;
        __pred.mine.territory_id._0_1_ = in_stack_fffffffffffff1ee;
        __pred.mine.territory_id._1_1_ = in_stack_fffffffffffff1ef;
        bVar2 = std::
                none_of<QList<QString>::const_iterator,QLocale::uiLanguages(QLocale::TagSeparator)const::__1>
                          (in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0,__pred);
        if (bVar2) {
          QList<QLocaleId>::prepend
                    ((QList<QLocaleId> *)
                     CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                     (parameter_type)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
          QLocaleId::name(in_stack_fffffffffffff268,in_stack_fffffffffffff267);
          QString::fromLatin1<void>
                    ((QByteArray *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
          QList<QString>::prepend
                    ((QList<QString> *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0)
                     ,(rvalue_ref)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
          QString::~QString((QString *)0x4dbcaf);
          QByteArray::~QByteArray((QByteArray *)0x4dbcbc);
        }
      }
      QString::~QString((QString *)0x4dbd62);
    }
    local_c48 = (undefined1 *)QList<QLocaleId>::size(&local_720);
    while (puVar10 = local_c48 + -1, 0 < (long)local_c48) {
      local_83c = 0xaaaaaaaa;
      local_838 = 0xaaaa;
      pQVar8 = QList<QLocaleId>::at
                         ((QList<QLocaleId> *)
                          CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                          CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
      local_83c._0_2_ = pQVar8->language_id;
      local_83c._2_2_ = pQVar8->script_id;
      local_838 = pQVar8->territory_id;
      if ((undefined2)local_83c == 1) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
                   (size_t)in_stack_fffffffffffff1d0);
        bVar2 = QListSpecialMethods<QString>::contains
                          ((QListSpecialMethods<QString> *)
                           CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
                           (QString *)in_stack_fffffffffffff1d0,
                           (CaseSensitivity)((ulong)in_stack_fffffffffffff1c8.i >> 0x20));
        QString::~QString((QString *)0x4dbea1);
        local_c48 = puVar10;
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
                     (size_t)in_stack_fffffffffffff1d0);
          QList<QString>::append
                    ((QList<QString> *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0)
                     ,(rvalue_ref)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
          QString::~QString((QString *)0x4dbef3);
        }
      }
      else {
        local_878[0] = &DAT_aaaaaaaaaaaaaaaa;
        local_888 = &DAT_aaaaaaaaaaaaaaaa;
        local_898 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_890 = &DAT_aaaaaaaaaaaaaaaa;
        QLocaleId::name(in_stack_fffffffffffff268,in_stack_fffffffffffff267);
        local_c49 = true;
        if ((bVar11) ||
           (in_stack_fffffffffffff298 = puVar10, qVar9 = QList<QString>::size(in_RDI),
           qVar9 <= (long)in_stack_fffffffffffff298)) {
          QLatin1String::QLatin1String
                    ((QLatin1String *)in_stack_fffffffffffff1d0,
                     (QByteArray *)in_stack_fffffffffffff1c8.i);
          str.m_data._0_2_ = in_stack_fffffffffffff1e8;
          str.m_size = (qsizetype)in_stack_fffffffffffff1e0;
          str.m_data._2_1_ = in_stack_fffffffffffff1ea;
          str.m_data._3_1_ = in_stack_fffffffffffff1eb;
          str.m_data._4_2_ = in_stack_fffffffffffff1ec.ucs;
          str.m_data._6_1_ = in_stack_fffffffffffff1ee;
          str.m_data._7_1_ = in_stack_fffffffffffff1ef;
          bVar2 = QListSpecialMethods<QString>::contains
                            ((QListSpecialMethods<QString> *)in_stack_fffffffffffff1c8.i,str,
                             in_stack_fffffffffffff1c4);
          if (!bVar2) {
            QString::fromLatin1<void>
                      ((QByteArray *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
            QList<QString>::append
                      ((QList<QString> *)
                       CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                       (rvalue_ref)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
            QString::~QString((QString *)0x4dc092);
          }
          local_878[0] = (undefined1 *)QList<QString>::size(in_RDI);
        }
        else {
          QList<QString>::at((QList<QString> *)
                             CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                             CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
          QLatin1String::QLatin1String
                    ((QLatin1String *)in_stack_fffffffffffff1d0,
                     (QByteArray *)in_stack_fffffffffffff1c8.i);
          local_c49 = ::operator==(in_stack_fffffffffffff1c8.i,
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
          local_878[0] = local_c48;
        }
        local_8d4 = 0xaaaa;
        local_8d8 = 0xaaaaaaaa;
        QVar5 = QLocaleId::withLikelySubtagsAdded(in_stack_fffffffffffff210);
        local_8d8 = QVar5._0_4_;
        local_8d4 = QVar5.territory_id;
        local_6d8 = &DAT_aaaaaaaaaaaaaaaa;
        local_6e8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_6e0 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_6f0 = &DAT_aaaaaaaaaaaaaaaa;
        local_708 = local_878;
        _local_6f8 = CONCAT44(CONCAT22(0xaaaa,local_8d4),local_8d8);
        _local_6f8 = CONCAT17(0xaa,CONCAT16(in_DL,_local_6f8));
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                   (QByteArray *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
        local_6d8 = (undefined1 *)CONCAT71(local_6d8._1_7_,local_c49);
        local_8de = local_8d8 & 0xffff;
        local_8da = 0;
        local_8e4 = 0;
        local_8e8 = local_8de;
        QLocale::uiLanguages::anon_class_56_6_d83b7451::operator()
                  ((anon_class_56_6_d83b7451 *)in_stack_fffffffffffff1f8.i,
                   SUB86((ulong)in_stack_fffffffffffff248 >> 0x10,0));
        if (local_8d8._2_2_ != 0) {
          local_8ee = local_8d8;
          local_8ea = 0;
          local_8f4 = 0;
          local_8f8 = local_8d8;
          QLocale::uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)in_stack_fffffffffffff1f8.i,
                     SUB86((ulong)in_stack_fffffffffffff248 >> 0x10,0));
        }
        if ((local_83c._2_2_ != 0) && (local_83c._2_2_ != local_8d8._2_2_)) {
          local_8fe = local_83c;
          local_8fa = 0;
          local_904 = 0;
          local_908 = local_83c;
          QLocale::uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)in_stack_fffffffffffff1f8.i,
                     SUB86((ulong)in_stack_fffffffffffff248 >> 0x10,0));
        }
        if (local_8d4 != 0) {
          local_90e = local_8d8 & 0xffff;
          local_90a = local_8d4;
          local_914 = local_8d4;
          local_918 = local_90e;
          QLocale::uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)in_stack_fffffffffffff1f8.i,
                     SUB86((ulong)in_stack_fffffffffffff248 >> 0x10,0));
        }
        if ((local_838 != 0) && (local_838 != local_8d4)) {
          local_91e = local_83c & 0xffff;
          local_91a = local_838;
          local_924 = local_838;
          local_928 = local_91e;
          QLocale::uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)in_stack_fffffffffffff1f8.i,
                     SUB86((ulong)in_stack_fffffffffffff248 >> 0x10,0));
        }
        if ((local_8d4 != 0) && (local_8d8._2_2_ != 0)) {
          local_92c = local_8d4;
          local_930 = local_8d8;
          local_934 = local_8d4;
          local_938 = local_8d8;
          QLocale::uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)in_stack_fffffffffffff1f8.i,
                     SUB86((ulong)in_stack_fffffffffffff248 >> 0x10,0));
        }
        if (((local_8d4 != 0) && (local_83c._2_2_ != 0)) && (local_83c._2_2_ != local_8d8._2_2_)) {
          local_93e = local_83c;
          local_93a = local_8d4;
          local_944 = local_8d4;
          local_948 = local_83c;
          QLocale::uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)in_stack_fffffffffffff1f8.i,
                     SUB86((ulong)in_stack_fffffffffffff248 >> 0x10,0));
        }
        if (((local_8d8._2_2_ != 0) && (local_838 != 0)) && (local_838 != local_8d4)) {
          local_958 = CONCAT22(local_8d8._2_2_,(short)local_83c);
          local_94a = local_838;
          local_954 = local_838;
          local_94e = local_958;
          QLocale::uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)in_stack_fffffffffffff1f8.i,
                     SUB86((ulong)in_stack_fffffffffffff248 >> 0x10,0));
        }
        if (((local_838 != 0) && (local_838 != local_8d4)) &&
           ((local_83c._2_2_ != 0 && (local_83c._2_2_ != local_8d8._2_2_)))) {
          local_95c = local_838;
          local_960 = local_83c;
          local_964 = local_838;
          local_968 = local_83c;
          QLocale::uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)in_stack_fffffffffffff1f8.i,
                     SUB86((ulong)in_stack_fffffffffffff248 >> 0x10,0));
        }
        uiLanguages(QLocale::TagSeparator)::~__2((anon_class_56_6_d83b7451 *)0x4dc6ff);
        QByteArray::~QByteArray((QByteArray *)0x4dc70c);
        local_c48 = puVar10;
      }
    }
    memcpy(local_6d0,&DAT_0094d128,0x688);
    QList<QString>::size(in_RDI);
    QDuplicateTracker<QString,_32UL>::QDuplicateTracker
              ((QDuplicateTracker<QString,_32UL> *)
               CONCAT17(in_stack_fffffffffffff207,
                        CONCAT16(in_stack_fffffffffffff206,in_stack_fffffffffffff200)),
               (qsizetype)in_stack_fffffffffffff1f8.i);
    local_c58 = (char *)0x0;
    while (qVar9 = QList<QString>::size(in_RDI), (long)local_c58 < qVar9) {
      QList<QString>::at((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
      bVar11 = QDuplicateTracker<QString,_32UL>::hasSeen
                         ((QDuplicateTracker<QString,_32UL> *)in_stack_fffffffffffff1c8.i,
                          (QString *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
      if (bVar11) {
        QList<QString>::remove(in_RDI,local_c58);
      }
      else {
        local_c58 = local_c58 + 1;
      }
    }
    local_969.ch = -0x56;
    QLatin1Char::QLatin1Char(&local_969,in_DL);
    pQVar14 = (QStringView *)CONCAT44(in_stack_fffffffffffff25c,in_stack_fffffffffffff258);
    local_96a = local_969.ch;
    local_c60 = (QStringView *)0x0;
    local_c68 = (QStringView *)0x0;
    local_c70 = (QStringView *)0x0;
    while (qVar9 = QList<QString>::size(in_RDI), (long)local_c70 < qVar9) {
      local_988 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_980 = &DAT_aaaaaaaaaaaaaaaa;
      local_978 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::at((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
      this_00 = (QLocaleId *)&local_988;
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                       (QString *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
      local_98c = 0xaaaa;
      local_990 = 0xaaaaaaaa;
      QStringView::QStringView<QString,_true>(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8.i)
      ;
      name_02.m_data._0_7_ = in_stack_fffffffffffff260;
      name_02.m_size = (qsizetype)pQVar14;
      name_02.m_data._7_1_ = in_stack_fffffffffffff267;
      QVar5 = QLocaleId::fromName(name_02);
      local_996 = QVar5._0_4_;
      local_992 = QVar5.territory_id;
      QVar5 = QLocaleId::withLikelySubtagsAdded(in_stack_fffffffffffff210);
      local_990 = QVar5._0_4_;
      local_98c = QVar5.territory_id;
      bVar13 = local_dc2;
      pQVar1 = local_c70;
      if ((long)local_c60 <= (long)local_c70) {
        do {
          local_c60 = (QStringView *)((long)&pQVar1->m_size + 1);
          pQVar14 = local_c60;
          qVar9 = QList<QString>::size(in_RDI);
          uVar15 = false;
          if ((long)pQVar14 < qVar9) {
            QList<QString>::at((QList<QString> *)
                               CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
            QStringView::QStringView<QString,_true>
                      (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8.i);
            name_03.m_data._0_7_ = in_stack_fffffffffffff260;
            name_03.m_size = (qsizetype)pQVar14;
            name_03.m_data._7_1_ = uVar15;
            QVar5 = QLocaleId::fromName(name_03);
            local_9b4 = QVar5._0_4_;
            local_9b0 = QVar5.territory_id;
            QVar5 = QLocaleId::withLikelySubtagsAdded(in_stack_fffffffffffff210);
            local_9ae[0]._0_4_ = QVar5._0_4_;
            local_9ae[0].territory_id = QVar5.territory_id;
            local_9cc = local_98c;
            local_9d0 = local_990;
            local_9d4 = CONCAT22(local_9d4._2_2_,local_98c);
            local_9d8 = local_990;
            uVar15 = QLocaleId::operator==
                               (local_9ae,(QLocaleId)((uint6)local_990 | (uint6)local_9d4 << 0x20));
          }
          pQVar1 = local_c60;
        } while ((bool)uVar15 != false);
        local_c68 = local_c60;
        in_stack_fffffffffffff267 = '\0';
        bVar13 = local_dc2;
      }
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                       (QString *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
      std::data<char16_t_const,2ul>((char16_t (*) [2])0xa0b2d2);
      for (local_b88 = 0; (local_b88 < 2 && (L"UTC"[local_b88 + 2] != L'\0'));
          local_b88 = local_b88 + 1) {
      }
      QStringView::QStringView<char16_t,_true>
                (in_stack_fffffffffffff1d0,(char16_t *)in_stack_fffffffffffff1c8.i,
                 CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
      bVar11 = false;
      stem_00.m_data._0_5_ = in_stack_fffffffffffff218;
      stem_00.m_size = (qsizetype)in_stack_fffffffffffff210;
      stem_00.m_data._5_1_ = in_stack_fffffffffffff21d;
      stem_00.m_data._6_1_ = bVar13;
      stem_00.m_data._7_1_ = in_stack_fffffffffffff21f;
      bVar2 = const::$_0::operator()
                        ((anon_class_1_1_ba1d3da2 *)in_stack_fffffffffffff1f0.i,
                         (QString *)
                         CONCAT17(in_stack_fffffffffffff1ef,
                                  CONCAT16(in_stack_fffffffffffff1ee,
                                           CONCAT24(in_stack_fffffffffffff1ec.ucs,
                                                    CONCAT13(in_stack_fffffffffffff1eb,
                                                             CONCAT12(in_stack_fffffffffffff1ea,
                                                                      in_stack_fffffffffffff1e8)))))
                         ,stem_00);
      local_dc2 = true;
      if (!bVar2) {
        QString::QString((QString *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         (QString *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
        bVar11 = true;
        std::data<char16_t_const,4ul>((char16_t (*) [4])0x93d80c);
        for (local_b60 = 0;
            (local_b60 < 4 &&
            (L"Invalid CBOR stream: illegal type found"[local_b60 + 0x24] != L'\0'));
            local_b60 = local_b60 + 1) {
        }
        QStringView::QStringView<char16_t,_true>
                  (in_stack_fffffffffffff1d0,(char16_t *)in_stack_fffffffffffff1c8.i,
                   CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
        stem_01.m_data._0_5_ = in_stack_fffffffffffff218;
        stem_01.m_size = (qsizetype)in_stack_fffffffffffff210;
        stem_01.m_data._5_1_ = in_stack_fffffffffffff21d;
        stem_01.m_data._6_1_ = bVar13;
        stem_01.m_data._7_1_ = in_stack_fffffffffffff21f;
        in_stack_fffffffffffff21f =
             const::$_0::operator()
                       ((anon_class_1_1_ba1d3da2 *)in_stack_fffffffffffff1f0.i,
                        (QString *)
                        CONCAT17(in_stack_fffffffffffff1ef,
                                 CONCAT16(in_stack_fffffffffffff1ee,
                                          CONCAT24(in_stack_fffffffffffff1ec.ucs,
                                                   CONCAT13(in_stack_fffffffffffff1eb,
                                                            CONCAT12(in_stack_fffffffffffff1ea,
                                                                     in_stack_fffffffffffff1e8))))),
                        stem_01);
        local_dc2 = (bool)in_stack_fffffffffffff21f;
      }
      if (bVar11) {
        QString::~QString((QString *)0x4dcdc6);
      }
      QString::~QString((QString *)0x4dcdd3);
      if ((local_dc2 & 1U) == 0) {
        local_c80 = QList<QString>::size(in_RDI);
        local_a40[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_a40[0].d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_a40[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         (QString *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
        while( true ) {
          local_a43 = local_969.ch;
          QChar::QChar<QLatin1Char,_true>
                    ((QChar *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                     (QLatin1Char)(char)((ulong)in_stack_fffffffffffff1c8.i >> 0x38));
          qVar9 = QString::lastIndexOf
                            ((QString *)
                             CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                             (QChar)(char16_t)((ulong)in_stack_fffffffffffff1c8.i >> 0x30),
                             in_stack_fffffffffffff1bc);
          if (qVar9 < 1) break;
          QString::first((QString *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
          in_stack_fffffffffffff210 = (QLocaleId *)local_a40;
          psVar12 = local_a60;
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
          QString::~QString((QString *)0x4dcf46);
          local_c89 = QDuplicateTracker<QString,_32UL>::contains
                                ((QDuplicateTracker<QString,_32UL> *)in_stack_fffffffffffff1c8.i,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
          in_stack_fffffffffffff21d = local_c89;
          QStringView::QStringView<QString,_true>
                    (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8.i);
          name_04.m_data._0_7_ = in_stack_fffffffffffff260;
          name_04.m_size = (qsizetype)pQVar14;
          name_04.m_data._7_1_ = in_stack_fffffffffffff267;
          QVar5 = QLocaleId::fromName(name_04);
          local_a66 = QVar5._0_4_;
          local_a62 = QVar5.territory_id;
          QVar5 = QLocaleId::withLikelySubtagsAdded(in_stack_fffffffffffff210);
          uStack_c8e = QVar5.script_id;
          bVar11 = uStack_c8e == local_990._2_2_;
          for (local_c98 = local_c68; uVar15 = local_c89 == false && (long)local_c98 < local_c80,
              local_c89 == false && (long)local_c98 < local_c80;
              local_c98 = (QStringView *)((long)&local_c98->m_size + 1)) {
            local_a98 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_a90 = &DAT_aaaaaaaaaaaaaaaa;
            local_a88 = &DAT_aaaaaaaaaaaaaaaa;
            QList<QString>::at((QList<QString> *)
                               CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                               CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
            QString::QString((QString *)
                             CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
            uVar3 = QString::startsWith(in_stack_fffffffffffff1c8.i,
                                        (QString *)
                                        CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0
                                                ),in_stack_fffffffffffff1bc);
            if ((bool)uVar3) {
              QString::size(local_a40);
              in_stack_fffffffffffff1ec =
                   QString::at(in_stack_fffffffffffff1c8.i,
                               CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
              QChar::QChar<QLatin1Char,_true>
                        ((QChar *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         (QLatin1Char)(char)((ulong)in_stack_fffffffffffff1c8.i >> 0x38));
              bVar2 = ::operator==((QChar *)CONCAT44(in_stack_fffffffffffff1c4,
                                                     in_stack_fffffffffffff1c0),
                                   (QChar *)CONCAT44(in_stack_fffffffffffff1bc,
                                                     in_stack_fffffffffffff1b8));
              if (bVar2) {
                bVar11 = false;
                QStringView::QStringView<QString,_true>
                          (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8.i);
                QChar::QChar<QLatin1Char,_true>
                          ((QChar *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                           (QLatin1Char)(char)((ulong)in_stack_fffffffffffff1c8.i >> 0x38));
                local_ca0 = (anon_class_1_1_ba1d3da2 *)
                            QStringView::lastIndexOf
                                      ((QStringView *)
                                       CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0)
                                       ,(QChar)(char16_t)
                                               ((ulong)in_stack_fffffffffffff1c8.i >> 0x30),
                                       in_stack_fffffffffffff1bc);
                while( true ) {
                  bVar2 = false;
                  if (local_c89 == false) {
                    qVar9 = QString::size(local_a40);
                    bVar2 = qVar9 < (long)local_ca0;
                    in_stack_fffffffffffff1e0 = local_ca0;
                  }
                  if (!bVar2) break;
                  QStringView::first((QStringView *)
                                     CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
                                     0x4dd3e2);
                  local_ca1 = false;
                  local_cb0 = local_c98;
                  while( true ) {
                    local_cb0 = (QStringView *)((long)&local_cb0->m_size + 1);
                    bVar2 = false;
                    if (local_ca1 == false) {
                      in_stack_fffffffffffff1d0 = local_cb0;
                      qVar9 = QList<QString>::size(in_RDI);
                      bVar2 = (long)in_stack_fffffffffffff1d0 < qVar9;
                    }
                    if (!bVar2) break;
                    QList<QString>::at((QList<QString> *)
                                       CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0)
                                       ,CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8
                                                ));
                    QStringView::QStringView<QString,_true>
                              (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8.i);
                    local_ca1 = ::operator==((QStringView *)
                                             CONCAT44(in_stack_fffffffffffff1c4,
                                                      in_stack_fffffffffffff1c0),
                                             (QStringView *)
                                             CONCAT44(in_stack_fffffffffffff1bc,
                                                      in_stack_fffffffffffff1b8));
                  }
                  if (local_ca1 == false) {
                    local_c89 = true;
                  }
                  QChar::QChar<QLatin1Char,_true>
                            ((QChar *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                             (QLatin1Char)(char)((ulong)in_stack_fffffffffffff1c8.i >> 0x38));
                  local_ca0 = (anon_class_1_1_ba1d3da2 *)
                              QStringView::lastIndexOf
                                        ((QStringView *)
                                         CONCAT44(in_stack_fffffffffffff1c4,
                                                  in_stack_fffffffffffff1c0),
                                         (QChar)(char16_t)
                                                ((ulong)in_stack_fffffffffffff1c8.i >> 0x30),
                                         in_stack_fffffffffffff1bc);
                }
                in_stack_fffffffffffff1eb = 0;
              }
            }
            else {
              local_ab8 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_ab0 = &DAT_aaaaaaaaaaaaaaaa;
              local_aa8 = &DAT_aaaaaaaaaaaaaaaa;
              local_adb = local_969.ch;
              QChar::QChar<QLatin1Char,_true>
                        ((QChar *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                         (QLatin1Char)(char)((ulong)in_stack_fffffffffffff1c8.i >> 0x38));
              QChar::QChar<char16_t,_true>(&local_ade,L'-');
              in_stack_fffffffffffff1f0.i =
                   QString::replace((QString *)
                                    CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260),
                                    (QChar)(char16_t)((ulong)in_stack_fffffffffffff298 >> 0x30),
                                    (QChar)(char16_t)((ulong)in_stack_fffffffffffff298 >> 0x20),
                                    (CaseSensitivity)((ulong)pQVar14 >> 0x20));
              QStringView::QStringView<QString,_true>
                        (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8.i);
              name_05.m_data._0_7_ = in_stack_fffffffffffff260;
              name_05.m_size = (qsizetype)pQVar14;
              name_05.m_data._7_1_ = in_stack_fffffffffffff267;
              QVar5 = QLocaleId::fromName(name_05);
              local_ac4 = QVar5._0_4_;
              local_ac0 = QVar5.territory_id;
              QVar5 = QLocaleId::withLikelySubtagsAdded(in_stack_fffffffffffff210);
              local_abe = QVar5._0_4_;
              local_aba = QVar5.territory_id;
              QLocaleId::name(this_00,in_stack_fffffffffffff267);
              QLatin1String::QLatin1String
                        ((QLatin1String *)in_stack_fffffffffffff1d0,
                         (QByteArray *)in_stack_fffffffffffff1c8.i);
              QStringView::QStringView<QString,_true>
                        (in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8.i);
              name_00.m_data._0_5_ = in_stack_fffffffffffff218;
              name_00.m_size = (qsizetype)in_stack_fffffffffffff210;
              name_00.m_data._5_1_ = in_stack_fffffffffffff21d;
              name_00.m_data._6_1_ = local_dc2;
              name_00.m_data._7_1_ = in_stack_fffffffffffff21f;
              stem.m_size._6_1_ = uVar3;
              stem.m_size._0_6_ = in_stack_fffffffffffff200;
              stem.m_size._7_1_ = uVar15;
              stem.m_data = psVar12;
              in_stack_fffffffffffff1ef =
                   const::$_0::operator()(in_stack_fffffffffffff1e0,name_00,stem);
              if ((bool)in_stack_fffffffffffff1ef) {
                bVar11 = false;
              }
              QByteArray::~QByteArray((QByteArray *)0x4dd28d);
            }
            QString::~QString((QString *)0x4dd548);
          }
          if (local_c89 != false) break;
          QDuplicateTracker<QString,_32UL>::hasSeen
                    ((QDuplicateTracker<QString,_32UL> *)in_stack_fffffffffffff1c8.i,
                     (QString *)CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
          if (bVar11) {
            local_c68 = (QStringView *)((long)&local_c68->m_size + 1);
            in_stack_fffffffffffff1c8 =
                 QList<QString>::insert
                           ((QList<QString> *)in_stack_fffffffffffff1c8.i,
                            CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                            (parameter_type)
                            CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8));
            local_c80 = local_c80 + 1;
          }
          else {
            QList<QString>::append
                      ((QList<QString> *)
                       CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0),
                       (parameter_type)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8)
                      );
          }
        }
        QString::~QString((QString *)0x4dd634);
      }
      QString::~QString((QString *)0x4dd64c);
      local_c70 = (QStringView *)((long)&local_c70->m_size + 1);
      if ((long)local_c60 <= (long)local_c70) {
        local_c70 = local_c68;
      }
    }
    QDuplicateTracker<QString,_32UL>::~QDuplicateTracker
              ((QDuplicateTracker<QString,_32UL> *)
               CONCAT44(in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0));
    QList<QLocaleId>::~QList((QList<QLocaleId> *)0x4dd6e0);
  }
  else {
    badSeparatorWarning((char *)in_stack_fffffffffffff1c8.i,
                        (char)(in_stack_fffffffffffff1c4 >> 0x18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QLocale::uiLanguages(TagSeparator separator) const
{
    const char sep = char(separator);
    QStringList uiLanguages;
    if (uchar(sep) > 0x7f) {
        badSeparatorWarning("uiLanguages", sep);
        return uiLanguages;
    }
    QList<QLocaleId> localeIds;
#ifdef QT_NO_SYSTEMLOCALE
    constexpr bool isSystem = false;
#else
    const bool isSystem = d->m_data == &systemLocaleData;
    if (isSystem) {
        uiLanguages = systemLocale()->query(QSystemLocale::UILanguages).toStringList();
        if (separator != TagSeparator::Dash) {
            // Map from default separator, Dash, used by backends:
            const QChar join = QLatin1Char(sep);
            uiLanguages = uiLanguages.replaceInStrings(u"-", QStringView(&join, 1));
        }
        // ... but we need to include likely-adjusted forms of each of those, too.
        // For now, collect up locale Ids representing the entries, for later processing:
        for (const auto &entry : std::as_const(uiLanguages))
            localeIds.append(QLocaleId::fromName(entry));
        if (localeIds.isEmpty())
            localeIds.append(systemLocale()->fallbackLocale().d->m_data->id());
        // If the system locale (isn't C and) didn't include itself in the list,
        // or as fallback, presume to know better than it and put its name
        // first. (Known issue, QTBUG-104930, on some macOS versions when in
        // locale en_DE.) Our translation system might have a translation for a
        // locale the platform doesn't believe in.
        const QString name = QString::fromLatin1(d->m_data->id().name(sep)); // Raw name
        if (!name.isEmpty() && language() != C && !uiLanguages.contains(name)) {
            // That uses contains(name) as a cheap pre-test, but there may be an
            // entry that matches this on purging likely subtags.
            const QLocaleId id = d->m_data->id();
            const QLocaleId mine = id.withLikelySubtagsRemoved();
            const auto isMine = [mine](const QString &entry) {
                return QLocaleId::fromName(entry).withLikelySubtagsRemoved() == mine;
            };
            if (std::none_of(uiLanguages.constBegin(), uiLanguages.constEnd(), isMine)) {
                localeIds.prepend(id);
                uiLanguages.prepend(QString::fromLatin1(id.name(sep)));
            }
        }
    } else
#endif
    {
        localeIds.append(d->m_data->id());
    }

    for (qsizetype i = localeIds.size(); i-- > 0; ) {
        const QLocaleId id = localeIds.at(i);
        Q_ASSERT(id.language_id);
        if (id.language_id == C) {
            if (!uiLanguages.contains(u"C"_s))
                uiLanguages.append(u"C"_s);
            // Attempt no likely sub-tag amendments to C.
            continue;
        }

        qsizetype j;
        const QByteArray prior = id.name(sep);
        bool faithful = true; // prior matches uiLanguages.at(j - 1)
        if (isSystem && i < uiLanguages.size()) {
            // Adding likely-adjusted forms to system locale's list.
            faithful = uiLanguages.at(i) == QLatin1StringView(prior);
            Q_ASSERT(faithful
                     // A legacy code may get mapped to an ID with a different name:
                     || QLocaleId::fromName(uiLanguages.at(i)).name(sep) == prior);
            // Insert just after the entry we're supplementing:
            j = i + 1;
        } else {
            // Plain locale or empty system uiLanguages; just append.
            if (!uiLanguages.contains(QLatin1StringView(prior)))
                uiLanguages.append(QString::fromLatin1(prior));
            j = uiLanguages.size();
        }

        const QLocaleId max = id.withLikelySubtagsAdded();
        Q_ASSERT(max.language_id);
        Q_ASSERT(max.language_id == id.language_id);
        // We can't say the same for script or territory, though.

        // We have various candidates to consider.
        const auto addIfEquivalent = [&j, &uiLanguages, max, sep, prior, faithful](QLocaleId cid) {
            if (cid.withLikelySubtagsAdded() == max) {
                if (const QByteArray name = cid.name(sep); name != prior)
                    uiLanguages.insert(j, QString::fromLatin1(name));
                else if (faithful) // Later candidates are more specific, so go before.
                    --j;
            }
        };
        // language
        addIfEquivalent({ max.language_id, 0, 0 });
        // language-script
        if (max.script_id)
            addIfEquivalent({ max.language_id, max.script_id, 0 });
        if (id.script_id && id.script_id != max.script_id)
            addIfEquivalent({ id.language_id, id.script_id, 0 });
        // language-territory
        if (max.territory_id)
            addIfEquivalent({ max.language_id, 0, max.territory_id });
        if (id.territory_id && id.territory_id != max.territory_id)
            addIfEquivalent({ id.language_id, 0, id.territory_id });
        // full
        if (max.territory_id && max.script_id)
            addIfEquivalent(max);
        if (max.territory_id && id.script_id && id.script_id != max.script_id)
            addIfEquivalent({ id.language_id, id.script_id, max.territory_id });
        if (max.script_id && id.territory_id && id.territory_id != max.territory_id)
            addIfEquivalent({ id.language_id, max.script_id, id.territory_id });
        if (id.territory_id && id.territory_id != max.territory_id
            && id.script_id && id.script_id != max.script_id) {
            addIfEquivalent(id);
        }
    }

    // Second pass: deduplicate.
    QDuplicateTracker<QString> known(uiLanguages.size());
    for (qsizetype i = 0; i < uiLanguages.size();) {
        if (known.hasSeen(uiLanguages.at(i)))
            uiLanguages.remove(i);
        else
            ++i;
    }

    // Third pass: add truncations, when not already present.
    // Cubic in list length, but hopefully that's at most a dozen or so.
    const QLatin1Char cut(sep);
    const auto hasPrefix = [cut](auto name, QStringView stem) {
        // A prefix only counts if it's either full or followed by a separator.
        return name.startsWith(stem)
            && (name.size() == stem.size() || name.at(stem.size()) == cut);
    };
    // As we now forward-traverse the list, we need to keep track of the
    // positions just after (a) the block of things added above that are
    // equivalent to the current entry and (b) the block of truncations (if any)
    // added just after this block. All truncations of entries in (a) belong at
    // the end of (b); once i advances to the end of (a) it must jump to just
    // after (b). The more specific entries in (a) may well have truncations
    // that can also arise from less specific ones later in (a); for the
    // purposes of determining whether such truncations go at the end of (b) or
    // the end of the list, we thus need to ignore these matches.
    qsizetype afterEquivs = 0;
    qsizetype afterTruncs = 0;
    // From here onwards, we only have the truncations we're adding, whose
    // truncations should all have been included already.
    // If advancing i brings us to the end of block (a), jump to the end of (b):
    for (qsizetype i = 0; i < uiLanguages.size(); ++i >= afterEquivs && (i = afterTruncs)) {
        const QString entry = uiLanguages.at(i);
        const QLocaleId max = QLocaleId::fromName(entry).withLikelySubtagsAdded();
        // Keep track of our two blocks:
        if (i >= afterEquivs) {
            Q_ASSERT(i >= afterTruncs); // i.e. we just skipped past the end of a block
            afterEquivs = i + 1;
            // Advance past equivalents of entry:
            while (afterEquivs < uiLanguages.size()
                   && QLocaleId::fromName(uiLanguages.at(afterEquivs))
                           .withLikelySubtagsAdded() == max) {
                ++afterEquivs;
            }
            // We'll add any truncations starting there:
            afterTruncs = afterEquivs;
        }
        if (hasPrefix(entry, u"C") || hasPrefix(entry, u"und"))
            continue;
        qsizetype stopAt = uiLanguages.size();
        QString prefix = entry;
        qsizetype at = 0;
        while ((at = prefix.lastIndexOf(cut)) > 0) {
            prefix = prefix.first(at);
            // Don't test with hasSeen() as we might defer adding to later, when
            // we'll need known to see the later entry's offering of this prefix
            // as a new entry.
            bool found = known.contains(prefix);
            /* By default we append but if no later entry has this as a prefix
               and the locale it implies would use the same script as entry, put
               it after the block of consecutive equivalents of which entry is a
               part instead. Thus [en-NL, nl-NL, en-GB] will append en but
               [en-NL, en-GB, nl-NL] will put it before nl-NL, for example. We
               require a script match so we don't pick translations that the
               user cannot read, despite knowing the language. (Ideally that
               would be a constraint the caller can opt into / out of. See
               QTBUG-112765.)
            */
            bool justAfter
                = (QLocaleId::fromName(prefix).withLikelySubtagsAdded().script_id == max.script_id);
            for (qsizetype j = afterTruncs; !found && j < stopAt; ++j) {
                QString later = uiLanguages.at(j);
                if (!later.startsWith(prefix)) {
                    const QByteArray laterFull =
                        QLocaleId::fromName(later.replace(cut, u'-')
                            ).withLikelySubtagsAdded().name(sep);
                    // When prefix matches a later entry's max, it belongs later.
                    if (hasPrefix(QLatin1StringView(laterFull), prefix))
                        justAfter = false;
                    continue;
                }
                // The duplicate tracker would already have spotted if equal:
                Q_ASSERT(later.size() > prefix.size());
                if (later.at(prefix.size()) == cut) {
                    justAfter = false;
                    // Prefix match. Shall produce the same prefix, but possibly
                    // after prefixes of other entries in the list. If later has
                    // a longer prefix not yet in the list, we want that before
                    // this shorter prefix, so leave this for later, otherwise,
                    // we include this prefix right away.
                    QStringView head{later};
                    for (qsizetype as = head.lastIndexOf(cut);
                         !found && as > prefix.size(); as = head.lastIndexOf(cut)) {
                        head = head.first(as);
                        bool seen = false;
                        for (qsizetype k = j + 1; !seen && k < uiLanguages.size(); ++k)
                            seen = uiLanguages.at(k) == head;
                        if (!seen)
                            found = true;
                    }
                }
            }
            if (found) // Don't duplicate.
                break; // any further truncations of prefix would also be found.
            // Now we're committed to adding it, get it into known:
            (void) known.hasSeen(prefix);
            if (justAfter) {
                uiLanguages.insert(afterTruncs++, prefix);
                ++stopAt; // All later entries have moved one step later.
            } else {
                uiLanguages.append(prefix);
            }
        }
    }

    return uiLanguages;
}